

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_gles2.c
# Opt level: O2

int main(void)

{
  char *__s;
  void *pvVar1;
  char cVar2;
  int iVar3;
  XVisualInfo *visinfo;
  GLXFBConfig p_Var4;
  Window WVar5;
  undefined8 uVar6;
  void *pvVar7;
  size_t __n;
  long lVar8;
  void *pvVar9;
  char *filename;
  GLuint q;
  int context_attribs [7];
  
  context_attribs[4] = 0x2092;
  context_attribs[5] = 0;
  context_attribs[6] = 0;
  context_attribs[0] = 0x9126;
  context_attribs[1] = 4;
  context_attribs[2] = 0x2091;
  context_attribs[3] = 2;
  dpy = get_display_or_skip();
  cVar2 = epoxy_has_glx_extension(dpy,0,"GLX_EXT_create_context_es2_profile");
  if (cVar2 == '\0') {
    iVar3 = 0x1030bc;
    filename = (char *)0x4d;
    goto LAB_001025ce;
  }
  visinfo = get_glx_visual(dpy);
  p_Var4 = get_fbconfig_for_visinfo(dpy,visinfo);
  WVar5 = get_glx_window(dpy,visinfo,false);
  uVar6 = (*_epoxy_glXCreateContextAttribsARB)(dpy,p_Var4,0,1,context_attribs);
  (*_epoxy_glXMakeCurrent)(dpy,WVar5,uVar6);
  cVar2 = epoxy_is_desktop_gl();
  if (cVar2 == '\0') {
    iVar3 = epoxy_gl_version();
    if (iVar3 < 0x14) {
      iVar3 = epoxy_gl_version();
      errx(SUB84((double)((float)iVar3 / 10.0),0),1,
           "GLES2 context creation made a version %f context\n");
    }
    else {
      iVar3 = (*_epoxy_glCreateShader)(0x8b30);
      if (iVar3 != 0) {
        (*_epoxy_glDeleteShader)(iVar3);
        iVar3 = epoxy_gl_version();
        if (iVar3 < 0x1e) {
          return 0;
        }
        q = 0;
        (*_epoxy_glGenQueries)(1,&q);
        if (q != 0) {
          (*_epoxy_glDeleteQueries)(1,&q);
          return 0;
        }
        iVar3 = 0x103167;
        goto LAB_001025cc;
      }
    }
    iVar3 = 0x10314e;
  }
  else {
    iVar3 = 0x1030ed;
  }
LAB_001025cc:
  filename = (char *)0x1;
LAB_001025ce:
  errx();
  pvVar7 = dlwrap_real_dlopen(filename,iVar3);
  if (filename != (char *)0x0) {
    lVar8 = 4;
    pvVar1 = (void *)0x105098;
    do {
      pvVar9 = pvVar1;
      lVar8 = lVar8 + -1;
      if (lVar8 == 0) goto LAB_0010262c;
      __s = *(char **)((long)pvVar9 + 0x18);
      __n = strlen(__s);
      iVar3 = strncmp(__s,filename,__n);
      pvVar1 = (void *)((long)pvVar9 + 0x18);
    } while (iVar3 != 0);
    *(void **)((long)pvVar9 + 0x28) = pvVar7;
    pvVar7 = (void *)((long)pvVar9 + 0x18);
  }
LAB_0010262c:
  return (int)pvVar7;
}

Assistant:

int main(void)
{
    bool pass = true;
    XVisualInfo *vis;
    Window win;
    GLXContext ctx;
    GLXFBConfig config;
    int context_attribs[] = {
        GLX_CONTEXT_PROFILE_MASK_ARB, GLX_CONTEXT_ES2_PROFILE_BIT_EXT,
        GLX_CONTEXT_MAJOR_VERSION_ARB, 2,
        GLX_CONTEXT_MINOR_VERSION_ARB, 0,
        0
    };
    GLuint shader;

    dpy = get_display_or_skip();

    if (!epoxy_has_glx_extension(dpy, 0, "GLX_EXT_create_context_es2_profile"))
        errx(77, "Test requires GLX_EXT_create_context_es2_profile");

    vis = get_glx_visual(dpy);
    config = get_fbconfig_for_visinfo(dpy, vis);
    win = get_glx_window(dpy, vis, false);

    ctx = glXCreateContextAttribsARB(dpy, config, NULL, true,
                                     context_attribs);

    glXMakeCurrent(dpy, win, ctx);

    if (epoxy_is_desktop_gl()) {
        errx(1, "GLES2 context creation made a desktop context\n");
    }

    if (epoxy_gl_version() < 20) {
        errx(1, "GLES2 context creation made a version %f context\n",
             epoxy_gl_version() / 10.0f);
    }

    /* Test using an entrypoint that's in GLES2, but not the desktop GL ABI. */
    shader = glCreateShader(GL_FRAGMENT_SHADER);
    if (shader == 0)
        errx(1, "glCreateShader() failed\n");
    glDeleteShader(shader);

    if (epoxy_gl_version() >= 30) {
        GLuint q = 0;

        glGenQueries(1, &q);
        if (!q)
            errx(1, "glGenQueries() failed\n");
        glDeleteQueries(1, &q);
    }

    return pass != true;
}